

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

PDFObject * __thiscall PDFObjectParser::ParseNewObject(PDFObjectParser *this)

{
  bool bVar1;
  __type _Var2;
  EPDFObjectType EVar3;
  int iVar4;
  PDFDictionary *inStreamDictionary;
  longlong lVar5;
  PDFInteger *this_00;
  undefined4 extraout_var;
  LongFilePositionType LVar6;
  PDFDictionary *pPVar7;
  ObjectIDType inObjectID;
  unsigned_long inVersion;
  PDFObjectParser *pPVar8;
  string *this_01;
  string token;
  string numberToken;
  string keywordToken;
  
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  pPVar8 = this;
  bVar1 = GetNextToken(this,&token);
  if (!bVar1) goto LAB_001a16a6;
  bVar1 = IsBoolean(pPVar8,&token);
  if (bVar1) {
    inStreamDictionary = (PDFDictionary *)ParseBoolean(pPVar8,&token);
    goto LAB_001a16a8;
  }
  bVar1 = IsLiteralString(pPVar8,&token);
  if (bVar1) {
    inStreamDictionary = (PDFDictionary *)ParseLiteralString(this,&token);
    goto LAB_001a16a8;
  }
  bVar1 = IsHexadecimalString(pPVar8,&token);
  if (bVar1) {
    inStreamDictionary = (PDFDictionary *)ParseHexadecimalString(this,&token);
    goto LAB_001a16a8;
  }
  this_01 = &scNull_abi_cxx11_;
  _Var2 = std::operator==(&scNull_abi_cxx11_,&token);
  if (_Var2) {
    inStreamDictionary = (PDFDictionary *)operator_new(0x48);
    PDFNull::PDFNull((PDFNull *)inStreamDictionary);
    goto LAB_001a16a8;
  }
  bVar1 = IsName((PDFObjectParser *)this_01,&token);
  if (bVar1) {
    inStreamDictionary = (PDFDictionary *)ParseName(this,&token);
    goto LAB_001a16a8;
  }
  bVar1 = IsNumber((PDFObjectParser *)this_01,&token);
  if (bVar1) {
    inStreamDictionary = (PDFDictionary *)ParseNumber((PDFObjectParser *)this_01,&token);
    if (inStreamDictionary != (PDFDictionary *)0x0) {
      EVar3 = PDFObject::GetType((PDFObject *)inStreamDictionary);
      if ((EVar3 != ePDFObjectInteger) ||
         (lVar5 = PDFInteger::GetValue((PDFInteger *)inStreamDictionary), lVar5 < 1))
      goto LAB_001a16a8;
      numberToken._M_dataplus._M_p = (pointer)&numberToken.field_2;
      numberToken._M_string_length = 0;
      numberToken.field_2._M_local_buf[0] = '\0';
      pPVar8 = this;
      bVar1 = GetNextToken(this,&numberToken);
      if (bVar1) {
        bVar1 = IsNumber(pPVar8,&numberToken);
        if (bVar1) {
          this_00 = (PDFInteger *)ParseNumber(pPVar8,&numberToken);
          if (((this_00 == (PDFInteger *)0x0) ||
              (EVar3 = PDFObject::GetType((PDFObject *)this_00), EVar3 != ePDFObjectInteger)) ||
             (lVar5 = PDFInteger::GetValue(this_00), lVar5 < 0)) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->mTokenBuffer,&numberToken);
            if (this_00 == (PDFInteger *)0x0) goto LAB_001a170d;
          }
          else {
            keywordToken._M_dataplus._M_p = (pointer)&keywordToken.field_2;
            keywordToken._M_string_length = 0;
            keywordToken.field_2._M_local_buf[0] = '\0';
            bVar1 = GetNextToken(this,&keywordToken);
            if (bVar1) {
              bVar1 = std::operator!=(&keywordToken,&scR_abi_cxx11_);
              if (!bVar1) {
                std::__cxx11::string::~string((string *)&keywordToken);
                pPVar7 = (PDFDictionary *)operator_new(0x58);
                inObjectID = PDFInteger::GetValue((PDFInteger *)inStreamDictionary);
                inVersion = PDFInteger::GetValue(this_00);
                PDFIndirectObjectReference::PDFIndirectObjectReference
                          ((PDFIndirectObjectReference *)pPVar7,inObjectID,inVersion);
                (*(inStreamDictionary->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1]
                )(inStreamDictionary);
                inStreamDictionary = pPVar7;
                goto LAB_001a1704;
              }
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->mTokenBuffer,&numberToken);
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->mTokenBuffer,&keywordToken);
            }
            std::__cxx11::string::~string((string *)&keywordToken);
          }
LAB_001a1704:
          (*(this_00->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])(this_00);
        }
        else {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->mTokenBuffer,&numberToken);
        }
      }
LAB_001a170d:
      std::__cxx11::string::~string((string *)&numberToken);
      goto LAB_001a16a8;
    }
  }
  else {
    _Var2 = std::operator==(&scLeftSquare_abi_cxx11_,&token);
    if (_Var2) {
      inStreamDictionary = (PDFDictionary *)ParseArray(this);
      goto LAB_001a16a8;
    }
    _Var2 = std::operator==(&scDoubleLeftAngle_abi_cxx11_,&token);
    if (!_Var2) {
      inStreamDictionary = (PDFDictionary *)operator_new(0x68);
      PDFSymbol::PDFSymbol((PDFSymbol *)inStreamDictionary,&token);
      goto LAB_001a16a8;
    }
    inStreamDictionary = (PDFDictionary *)ParseDictionary(this);
    if (inStreamDictionary != (PDFDictionary *)0x0) {
      bVar1 = GetNextToken(this,&token);
      if (bVar1) {
        _Var2 = std::operator==(&scStream_abi_cxx11_,&token);
        if (_Var2) {
          pPVar7 = (PDFDictionary *)operator_new(0x58);
          iVar4 = (*this->mCurrentPositionProvider->_vptr_IReadPositionProvider[2])();
          LVar6 = PDFParserTokenizer::GetReadBufferSize(&this->mTokenizer);
          PDFStreamInput::PDFStreamInput
                    ((PDFStreamInput *)pPVar7,inStreamDictionary,
                     CONCAT44(extraout_var,iVar4) - LVar6);
          inStreamDictionary = pPVar7;
        }
        else {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->mTokenBuffer,&token);
        }
      }
      goto LAB_001a16a8;
    }
  }
LAB_001a16a6:
  inStreamDictionary = (PDFDictionary *)0x0;
LAB_001a16a8:
  std::__cxx11::string::~string((string *)&token);
  return &inStreamDictionary->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseNewObject()
{
	PDFObject* pdfObject = NULL;
	std::string token;

	do
	{
		if(!GetNextToken(token))
			break;

		// based on the parsed token, and perhaps some more, determine the type of object
		// and how to parse it.

		// Boolean
		if(IsBoolean(token))
		{
			pdfObject = ParseBoolean(token);
			break;
		} 
		// Literal String
		else if(IsLiteralString(token))
		{
			pdfObject = ParseLiteralString(token);
			break;
		}
		// Hexadecimal String
		else if(IsHexadecimalString(token))
		{
			pdfObject = ParseHexadecimalString(token);
			break;
		}
		// NULL
		else if (IsNull(token))
		{
			pdfObject = new PDFNull();
			break;
		}
		// Name
		else if(IsName(token))
		{
			pdfObject = ParseName(token);
			break;
		}
		// Number (and possibly an indirect reference)
		else if(IsNumber(token))
		{	
			pdfObject = ParseNumber(token);
			
			// this could be an indirect reference in case this is a positive integer
			// and the next one is also, and then there's an "R" keyword
			if(pdfObject && 
				(pdfObject->GetType() == PDFObject::ePDFObjectInteger) && 
				((PDFInteger*)pdfObject)->GetValue() > 0)
			{
				// try parse version
				std::string numberToken;
				if(!GetNextToken(numberToken)) // k. no next token...cant be reference
					break;

				if(!IsNumber(numberToken)) // k. no number, cant be reference
				{
					SaveTokenToBuffer(numberToken);
					break;
				}

				PDFObject* versionObject = ParseNumber(numberToken); 
				bool isReference = false;
				do
				{
					if(!versionObject || 
                       (versionObject->GetType() != PDFObject::ePDFObjectInteger) ||
						((PDFInteger*)versionObject)->GetValue() < 0) // k. failure to parse number, or no non-negative, cant be reference
					{
						SaveTokenToBuffer(numberToken);
						break;
					}

					// try parse R keyword
					std::string keywordToken;
					if(!GetNextToken(keywordToken)) // k. no next token...cant be reference
						break;

					if(keywordToken != scR) // k. not R...cant be reference
					{
						SaveTokenToBuffer(numberToken);
						SaveTokenToBuffer(keywordToken);
						break;
					}

					isReference = true;
				}while(false);

				// if passed all these, then this is a reference
				if(isReference)
				{
					PDFObject* referenceObject = new PDFIndirectObjectReference(
														(ObjectIDType)((PDFInteger*)pdfObject)->GetValue(),
														(unsigned long)((PDFInteger*)versionObject)->GetValue());
					delete pdfObject;
					pdfObject = referenceObject;
				}
				delete versionObject;
			}
			break;
		}
		// Array
		else if(IsArray(token))
		{
			pdfObject = ParseArray();
			break;
		}
		// Dictionary
		else if (IsDictionary(token))
		{
			pdfObject = ParseDictionary();

			if(pdfObject)
			{
				// could be a stream. will be if the next token is the "stream" keyword
				if(!GetNextToken(token))
					break;

				if(scStream == token) 
				{
					// yes, found a stream. record current position as the position where the stream starts. 
					// remove from the current stream position the size of the tokenizer buffer, which is "read", but not used
					pdfObject = new PDFStreamInput((PDFDictionary*)pdfObject, mCurrentPositionProvider->GetCurrentPosition() - mTokenizer.GetReadBufferSize());
				}
				else
				{
					SaveTokenToBuffer(token);
				}
			}

			break;
		}
		// Symbol (legitimate keyword or error. determine if error based on semantics)
		else
			pdfObject = new PDFSymbol(token);
	}while(false);


	return pdfObject;

}